

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_catalog_set.hpp
# Opt level: O2

void __thiscall
duckdb::DependencyCatalogSet::DependencyCatalogSet
          (DependencyCatalogSet *this,CatalogSet *set,CatalogEntryInfo *info)

{
  this->set = set;
  CatalogEntryInfo::CatalogEntryInfo(&this->info,info);
  MangledEntryName::MangledEntryName(&this->mangled_name,info);
  return;
}

Assistant:

DependencyCatalogSet(CatalogSet &set, const CatalogEntryInfo &info)
	    : set(set), info(info), mangled_name(DependencyManager::MangleName(info)) {
	}